

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LimitedMultiLevelBreitWigner.test.cpp
# Opt level: O3

string * chunk_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 1.500000+0 5.410000-1          0          0          2          0112532151     \n 2.279200+1 0.000000+0          0          0         54          3112532151     \n 2.810000+3 1.000000+0 3.763500+2 3.760000+2 3.530000-1 0.000000+0112532151     \n 1.600000+3 2.250000+2 0.000000+0 2.500000-3 0.000000+0 0.000000+0112532151     \n 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0112532151     \n 2.429700+5 1.000000+0 3.295000+2 3.280000+2 1.500000+0 0.000000+0112532151     \n 1.100000+3 3.400000+2 0.000000+0 6.100000-2 0.000000+0 0.000000+0112532151     \n 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0112532151     \n 2.983200+5 2.000000+0 2.039000+3 2.038000+3 1.020000+0 0.000000+0112532151     \n 1.400000+3 7.100000+2 0.000000+0 8.300000-3 0.000000+0 0.000000+0112532151     \n 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0112532151     \n 2.279200+1 0.000000+0          1          0         36          2112532151     \n 7.617000+3 2.000000+0 6.058000-1 5.800000-3 6.000000-1 0.000000+0112532151     \n 1.000000+2 9.000000-6 0.000000+0 9.000000-2 0.000000+0 0.000000+0112532151     \n 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0112532151     \n 3.923200+5 1.000000+0 2.277000+4 2.276000+4 9.870000+0 0.000000+0112532151     \n 1.300000+5 6.100000+4 0.000000+0 2.400000+0 0.000000+0 0.000000+0112532151     \n 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0112532151     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunk() {
  return
    " 1.500000+0 5.410000-1          0          0          2          0112532151     \n"
    " 2.279200+1 0.000000+0          0          0         54          3112532151     \n"
    " 2.810000+3 1.000000+0 3.763500+2 3.760000+2 3.530000-1 0.000000+0112532151     \n"
    " 1.600000+3 2.250000+2 0.000000+0 2.500000-3 0.000000+0 0.000000+0112532151     \n"
    " 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0112532151     \n"
    " 2.429700+5 1.000000+0 3.295000+2 3.280000+2 1.500000+0 0.000000+0112532151     \n"
    " 1.100000+3 3.400000+2 0.000000+0 6.100000-2 0.000000+0 0.000000+0112532151     \n"
    " 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0112532151     \n"
    " 2.983200+5 2.000000+0 2.039000+3 2.038000+3 1.020000+0 0.000000+0112532151     \n"
    " 1.400000+3 7.100000+2 0.000000+0 8.300000-3 0.000000+0 0.000000+0112532151     \n"
    " 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0112532151     \n"
    " 2.279200+1 0.000000+0          1          0         36          2112532151     \n"
    " 7.617000+3 2.000000+0 6.058000-1 5.800000-3 6.000000-1 0.000000+0112532151     \n"
    " 1.000000+2 9.000000-6 0.000000+0 9.000000-2 0.000000+0 0.000000+0112532151     \n"
    " 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0112532151     \n"
    " 3.923200+5 1.000000+0 2.277000+4 2.276000+4 9.870000+0 0.000000+0112532151     \n"
    " 1.300000+5 6.100000+4 0.000000+0 2.400000+0 0.000000+0 0.000000+0112532151     \n"
    " 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0112532151     \n";
}